

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O1

double __thiscall phyr::Sphere::pdf(Sphere *this,Interaction *ref,Vector3f *wi)

{
  Transform *pTVar1;
  bool bVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int i;
  int iVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  Point3f op;
  double local_38 [4];
  double local_18 [3];
  
  pTVar1 = (this->super_Shape).localToWorld;
  dVar11 = (pTVar1->mat).d[0][2] * 0.0 + (pTVar1->mat).d[0][0] * 0.0 + (pTVar1->mat).d[0][1] * 0.0 +
           (pTVar1->mat).d[0][3];
  dVar12 = (pTVar1->mat).d[1][2] * 0.0 + (pTVar1->mat).d[1][0] * 0.0 + (pTVar1->mat).d[1][1] * 0.0 +
           (pTVar1->mat).d[1][3];
  dVar14 = (pTVar1->mat).d[3][2] * 0.0 + (pTVar1->mat).d[3][0] * 0.0 + (pTVar1->mat).d[3][1] * 0.0 +
           (pTVar1->mat).d[3][3];
  bVar2 = NAN(dVar14);
  bVar3 = dVar14 == 1.0;
  dVar14 = 1.0 / dVar14;
  dVar10 = dVar11 * dVar14;
  if ((bVar3) && (!bVar2)) {
    dVar10 = dVar11;
  }
  dVar13 = (pTVar1->mat).d[2][2] * 0.0 + (pTVar1->mat).d[2][0] * 0.0 + (pTVar1->mat).d[2][1] * 0.0 +
           (pTVar1->mat).d[2][3];
  dVar11 = dVar12 * dVar14;
  if ((bVar3) && (!bVar2)) {
    dVar11 = dVar12;
  }
  dVar14 = dVar14 * dVar13;
  if ((bVar3) && (!bVar2)) {
    dVar14 = dVar13;
  }
  dVar4 = (ref->p).x;
  dVar5 = (ref->p).y;
  dVar12 = (ref->p).z;
  dVar13 = (ref->n).z;
  dVar6 = (ref->n).x;
  dVar7 = (ref->n).y;
  dVar15 = (ABS(dVar6) * (ref->pfError).x + ABS(dVar7) * (ref->pfError).y +
           ABS(dVar13) * (ref->pfError).z) * 1024.0;
  local_18[0] = dVar15 * dVar6;
  local_18[1] = dVar15 * dVar7;
  local_18[2] = dVar15 * dVar13;
  if ((dVar14 - dVar12) * dVar13 + (dVar10 - dVar4) * dVar6 + dVar7 * (dVar11 - dVar5) < 0.0) {
    local_18[0] = -(dVar15 * dVar6);
    local_18[1] = -(dVar15 * dVar7);
    local_18[2] = -(dVar15 * dVar13);
  }
  local_38[0] = dVar4 + local_18[0];
  local_38[1] = dVar5 + local_18[1];
  local_38[2] = local_18[2] + dVar12;
  iVar8 = 0;
  do {
    lVar9 = 0;
    if (iVar8 != 0) {
      lVar9 = (ulong)(iVar8 != 1) * 8 + 8;
    }
    if (*(double *)((long)local_18 + lVar9) <= 0.0) {
      if (*(double *)((long)local_18 + lVar9) < 0.0) {
        dVar13 = *(double *)((long)local_38 + lVar9);
        if (-INFINITY < dVar13) {
          dVar13 = (double)(~-(ulong)(dVar13 == 0.0) & (ulong)dVar13 |
                           -(ulong)(dVar13 == 0.0) & 0x8000000000000000);
          dVar13 = (double)((long)dVar13 + (ulong)(dVar13 <= 0.0) * 2 + -1);
        }
        goto LAB_0010b0ec;
      }
    }
    else {
      dVar13 = *(double *)((long)local_38 + lVar9);
      if (dVar13 < INFINITY) {
        dVar13 = (double)(~-(ulong)(dVar13 == 0.0) & (ulong)dVar13);
        dVar13 = (double)((-(ulong)(dVar13 < 0.0) | 1) + (long)dVar13);
      }
LAB_0010b0ec:
      *(double *)((long)local_38 + lVar9) = dVar13;
    }
    iVar8 = iVar8 + 1;
    if (iVar8 == 3) {
      dVar13 = this->radius * this->radius;
      if ((local_38[2] - dVar14) * (local_38[2] - dVar14) +
          (local_38[0] - dVar10) * (local_38[0] - dVar10) +
          (local_38[1] - dVar11) * (local_38[1] - dVar11) <= dVar13) {
        dVar10 = Shape::pdf(&this->super_Shape,ref,wi);
        return dVar10;
      }
      dVar10 = 1.0 - dVar13 / ((dVar12 - dVar14) * (dVar12 - dVar14) +
                              (dVar4 - dVar10) * (dVar4 - dVar10) +
                              (dVar5 - dVar11) * (dVar5 - dVar11));
      if (dVar10 <= 0.0) {
        dVar10 = 0.0;
      }
      if (dVar10 < 0.0) {
        dVar10 = sqrt(dVar10);
      }
      else {
        dVar10 = SQRT(dVar10);
      }
      dVar10 = uniformConePdf(dVar10);
      return dVar10;
    }
  } while( true );
}

Assistant:

Real Sphere::pdf(const Interaction& ref, const Vector3f& wi) const {
    Point3f pCenter = (*localToWorld)(Point3f(0, 0, 0));
    // Return uniform PDF if point is inside sphere
    Point3f pOrigin =
        offsetRayOrigin(ref.p, ref.n, pCenter - ref.p, ref.pfError);
    if (distanceSquared(pOrigin, pCenter) <= radius * radius)
        return Shape::pdf(ref, wi);

    // Compute general sphere PDF
    Real sinThetaMax2 = radius * radius / distanceSquared(ref.p, pCenter);
    Real cosThetaMax = std::sqrt(std::max((Real)0, 1 - sinThetaMax2));
    return uniformConePdf(cosThetaMax);
}